

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void __thiscall FNotifyBuffer::Tick(FNotifyBuffer *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint deletecount;
  int iStack_8;
  
  iVar1 = this->Top;
  if (iVar1 < this->TopGoal) {
    iStack_8 = 1;
  }
  else {
    if (iVar1 <= this->TopGoal) goto LAB_0036ff2a;
    iStack_8 = -1;
  }
  this->Top = iVar1 + iStack_8;
LAB_0036ff2a:
  uVar2 = (this->Text).Count;
  uVar3 = 0;
  while ((deletecount = uVar2, uVar2 != uVar3 &&
         ((iVar1 = (this->Text).Array[uVar3].TimeOut, iVar1 == 0 ||
          (deletecount = uVar3, iVar1 <= gametic))))) {
    uVar3 = uVar3 + 1;
  }
  if (deletecount == 0) {
    return;
  }
  TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,deletecount);
  return;
}

Assistant:

void FNotifyBuffer::Tick()
{
	if (TopGoal > Top)
	{
		Top++;
	}
	else if (TopGoal < Top)
	{
		Top--;
	}

	// Remove lines from the beginning that have expired.
	unsigned i;
	for (i = 0; i < Text.Size(); ++i)
	{
		if (Text[i].TimeOut != 0 && Text[i].TimeOut > gametic)
			break;
	}
	if (i > 0)
	{
		Text.Delete(0, i);
	}
}